

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_BanDatabase.cpp
# Opt level: O2

void __thiscall RenX::BanDatabase::process_file_finish(BanDatabase *this,FILE *file)

{
  pointer puVar1;
  FILE *pFVar2;
  ostream *poVar3;
  size_t in_RCX;
  unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_> *entry;
  pointer puVar4;
  
  if (2 < this->m_read_version) {
    if (this->m_read_version < this->m_write_version) {
      pFVar2 = freopen((this->m_filename)._M_dataplus._M_p,"wb",(FILE *)file);
      if (pFVar2 != (FILE *)0x0) {
        (**(code **)(*(long *)this + 0x10))(this,file);
        puVar1 = (this->m_entries).
                 super__Vector_base<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (puVar4 = (this->m_entries).
                      super__Vector_base<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>,_std::allocator<std::unique_ptr<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1;
            puVar4 = puVar4 + 1) {
          write(this,(int)(puVar4->_M_t).
                          super___uniq_ptr_impl<RenX::BanDatabase::Entry,_std::default_delete<RenX::BanDatabase::Entry>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_RenX::BanDatabase::Entry_*,_std::default_delete<RenX::BanDatabase::Entry>_>
                          .super__Head_base<0UL,_RenX::BanDatabase::Entry_*,_false>._M_head_impl,
                file,in_RCX);
        }
      }
    }
    fgetpos((FILE *)file,(fpos_t *)&this->m_eof);
    return;
  }
  pFVar2 = freopen((this->m_filename)._M_dataplus._M_p,"wb",(FILE *)file);
  if (pFVar2 != (FILE *)0x0) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "Warning: Unsupported ban database file version. The database will be removed and rewritten."
                            );
    std::endl<char,std::char_traits<char>>(poVar3);
    (**(code **)(*(long *)this + 0x10))(this,file);
    fgetpos((FILE *)file,(fpos_t *)&this->m_eof);
    this->m_read_version = this->m_write_version;
    return;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "FATAL ERROR: UNABLE TO REMOVE UNSUPPORTED BAN DATABASE FILE VERSION");
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void RenX::BanDatabase::process_file_finish(FILE *file) {
	if (m_read_version < 3) {
		if (freopen(m_filename.c_str(), "wb", file) == nullptr) {
			std::cout << "FATAL ERROR: UNABLE TO REMOVE UNSUPPORTED BAN DATABASE FILE VERSION" << std::endl;
			return;
		}

		std::cout << "Warning: Unsupported ban database file version. The database will be removed and rewritten." << std::endl;
		create_header(file);
		fgetpos(file, std::addressof(m_eof));
		m_read_version = m_write_version;
		return;
	}
	else if (m_read_version < m_write_version) {
		if (freopen(m_filename.c_str(), "wb", file) != nullptr) {
			this->create_header(file);
			for (const auto& entry : m_entries) {
				write(entry.get(), file);
			}
		}
	}

	fgetpos(file, std::addressof(m_eof));
}